

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaggageRestrictionManager.cpp
# Opt level: O0

void __thiscall
jaegertracing::thrift::BaggageRestrictionManagerClient::send_getBaggageRestrictions
          (BaggageRestrictionManagerClient *this,string *serviceName)

{
  TProtocol *this_00;
  element_type *peVar1;
  void *__buf;
  undefined1 local_88 [16];
  undefined1 local_78 [24];
  BaggageRestrictionManager_getBaggageRestrictions_pargs args;
  allocator local_41;
  string local_40;
  int32_t local_1c;
  string *psStack_18;
  int32_t cseqid;
  string *serviceName_local;
  BaggageRestrictionManagerClient *this_local;
  
  local_1c = 0;
  this_00 = this->oprot_;
  psStack_18 = serviceName;
  serviceName_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"getBaggageRestrictions",&local_41);
  apache::thrift::protocol::TProtocol::writeMessageBegin(this_00,&local_40,T_CALL,local_1c);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  BaggageRestrictionManager_getBaggageRestrictions_pargs::
  BaggageRestrictionManager_getBaggageRestrictions_pargs
            ((BaggageRestrictionManager_getBaggageRestrictions_pargs *)(local_78 + 0x10));
  args._vptr_BaggageRestrictionManager_getBaggageRestrictions_pargs = (_func_int **)psStack_18;
  BaggageRestrictionManager_getBaggageRestrictions_pargs::write
            ((BaggageRestrictionManager_getBaggageRestrictions_pargs *)(local_78 + 0x10),
             (int)this->oprot_,__buf,(size_t)psStack_18);
  apache::thrift::protocol::TProtocol::writeMessageEnd(this->oprot_);
  apache::thrift::protocol::TProtocol::getTransport((TProtocol *)local_78);
  peVar1 = std::
           __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_78);
  (*peVar1->_vptr_TTransport[10])();
  std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<apache::thrift::transport::TTransport> *)local_78);
  apache::thrift::protocol::TProtocol::getTransport((TProtocol *)local_88);
  peVar1 = std::
           __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
  (*peVar1->_vptr_TTransport[0xb])();
  std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<apache::thrift::transport::TTransport> *)local_88);
  BaggageRestrictionManager_getBaggageRestrictions_pargs::
  ~BaggageRestrictionManager_getBaggageRestrictions_pargs
            ((BaggageRestrictionManager_getBaggageRestrictions_pargs *)(local_78 + 0x10));
  return;
}

Assistant:

void BaggageRestrictionManagerClient::send_getBaggageRestrictions(const std::string& serviceName)
{
  int32_t cseqid = 0;
  oprot_->writeMessageBegin("getBaggageRestrictions", ::apache::thrift::protocol::T_CALL, cseqid);

  BaggageRestrictionManager_getBaggageRestrictions_pargs args;
  args.serviceName = &serviceName;
  args.write(oprot_);

  oprot_->writeMessageEnd();
  oprot_->getTransport()->writeEnd();
  oprot_->getTransport()->flush();
}